

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O2

int ndiGetTXPassiveStray(ndicapi *pol,int i,double *coord)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  
  if (pol->TxPassiveStray[0] != '\0') {
    uVar1 = pol->TxPassiveStrayCount;
    uVar4 = 0x32;
    if (uVar1 < 0x32) {
      uVar4 = uVar1;
    }
    iVar2 = 2;
    if ((-1 < (int)uVar1) && ((uint)i < uVar4)) {
      uVar5 = (ulong)(uint)(i * 0x15);
      lVar3 = ndiSignedToLong(pol->TxPassiveStray + uVar5,7);
      *coord = (double)lVar3 * 0.01;
      lVar3 = ndiSignedToLong(pol->TxPassiveStray + uVar5 + 7,7);
      coord[1] = (double)lVar3 * 0.01;
      lVar3 = ndiSignedToLong(pol->TxPassiveStray + uVar5 + 0xe,7);
      coord[2] = (double)lVar3 * 0.01;
      iVar2 = 0;
    }
    return iVar2;
  }
  return 1;
}

Assistant:

ndicapiExport int ndiGetTXPassiveStray(ndicapi* pol, int i, double coord[3])
{
  const char* dp;
  int n;

  dp = pol->TxPassiveStray;

  if (*dp == '\0')
  {
    return NDI_DISABLED;
  }

  n = pol->TxPassiveStrayCount;
  if (n < 0)
  {
    return NDI_MISSING;
  }
  if (n > 50)
  {
    n = 50;
  }

  if (i < 0 || i >= n)
  {
    return NDI_MISSING;
  }

  dp += 7 * 3 * i;
  coord[0] = ndiSignedToLong(&dp[0],  7) * 0.01;
  coord[1] = ndiSignedToLong(&dp[7],  7) * 0.01;
  coord[2] = ndiSignedToLong(&dp[14], 7) * 0.01;

  return NDI_OKAY;
}